

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyvalues.cpp
# Opt level: O1

bool __thiscall KV::KeyValues::getValueAsBool(KeyValues *this,bool defaultVal)

{
  int iVar1;
  _Alloc_hider __nptr;
  int *piVar2;
  long lVar3;
  undefined1 auVar4 [12];
  char *local_30;
  
  if ((this->value).
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    __nptr._M_p = (this->value).
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_payload._M_value._M_dataplus._M_p;
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    *piVar2 = 0;
    lVar3 = strtol(__nptr._M_p,&local_30,10);
    if (local_30 == __nptr._M_p) {
      std::__throw_invalid_argument("stoi");
    }
    else if (((int)lVar3 == lVar3) && (*piVar2 != 0x22)) {
      if (*piVar2 == 0) {
        *piVar2 = iVar1;
      }
      return (int)lVar3 != 0;
    }
    auVar4 = std::__throw_out_of_range("stoi");
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
    }
    if (auVar4._8_4_ != 1) {
      _Unwind_Resume(auVar4._0_8_);
    }
    __cxa_begin_catch();
    __cxa_end_catch();
  }
  return defaultVal;
}

Assistant:

bool KeyValues::getValueAsBool( bool defaultVal /*= false*/ ) const
	{
		if ( !value )
			return defaultVal;

		try
		{
			return ( std::stoi( value.value() ) != 0 );
		}
		catch ( const std::exception& )
		{
			return defaultVal;
		}
	}